

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::detail::filldata<const_int[3]>::fill(ostream *stream,int (*in) [3])

{
  int (*s) [3];
  String local_38;
  ulong local_20;
  size_t i;
  int (*in_local) [3];
  ostream *stream_local;
  
  i = (size_t)in;
  in_local = (int (*) [3])stream;
  std::operator<<(stream,"[");
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    if (local_20 != 0) {
      std::operator<<((ostream *)in_local,", ");
    }
    s = in_local;
    doctest::toString(&local_38,*(int *)(i + local_20 * 4));
    doctest::operator<<((ostream *)s,&local_38);
    String::~String(&local_38);
  }
  std::operator<<((ostream *)in_local,"]");
  return;
}

Assistant:

static void fill(std::ostream* stream, const T(&in)[N]) {
            *stream << "[";
            for (size_t i = 0; i < N; i++) {
                if (i != 0) { *stream << ", "; }
                *stream << (DOCTEST_STRINGIFY(in[i]));
            }
            *stream << "]";
        }